

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int ARKodeSetAdjointCheckpointIndex(void *arkode_mem,suncountertype step_index)

{
  long in_RSI;
  ARKodeMem in_RDI;
  ARKodeMem ark_mem;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x88e,"ARKodeSetAdjointCheckpointIndex",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_io.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RSI < 0) {
    arkProcessError(in_RDI,-0x16,0x896,"ARKodeSetAdjointCheckpointIndex",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_io.c"
                    ,"step_index must be >= 0");
    local_4 = -0x16;
  }
  else {
    in_RDI->checkpoint_step_idx = in_RSI;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ARKodeSetAdjointCheckpointIndex(void* arkode_mem, suncountertype step_index)
{
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  if (step_index < 0)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "step_index must be >= 0");
    return ARK_ILL_INPUT;
  }

  ark_mem->checkpoint_step_idx = step_index;

  return (ARK_SUCCESS);
}